

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

int __thiscall cmake::LoadCache(cmake *this)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  allocator local_31;
  string cacheFile;
  
  pcVar3 = GetHomeOutputDirectory(this);
  std::__cxx11::string::string((string *)&cacheFile,pcVar3,&local_31);
  bVar1 = LoadCache(this,&cacheFile);
  std::__cxx11::string::~string((string *)&cacheFile);
  if (!bVar1) {
    pcVar3 = GetHomeOutputDirectory(this);
    std::__cxx11::string::string((string *)&cacheFile,pcVar3,&local_31);
    std::__cxx11::string::append((char *)&cacheFile);
    bVar1 = cmsys::SystemTools::FileExists(cacheFile._M_dataplus._M_p);
    if (bVar1) {
      cmSystemTools::Error
                ("There is a CMakeCache.txt file for the current binary tree but cmake does not have permission to read it. Please check the permissions of the directory you are trying to run CMake on."
                 ,(char *)0x0,(char *)0x0,(char *)0x0);
      std::__cxx11::string::~string((string *)&cacheFile);
      return -1;
    }
    std::__cxx11::string::~string((string *)&cacheFile);
  }
  iVar2 = AddCMakePaths(this);
  return iVar2 * 3 + -3;
}

Assistant:

int cmake::LoadCache()
{
  // could we not read the cache
  if (!this->LoadCache(this->GetHomeOutputDirectory())) {
    // if it does exist, but isn't readable then warn the user
    std::string cacheFile = this->GetHomeOutputDirectory();
    cacheFile += "/CMakeCache.txt";
    if (cmSystemTools::FileExists(cacheFile.c_str())) {
      cmSystemTools::Error(
        "There is a CMakeCache.txt file for the current binary tree but "
        "cmake does not have permission to read it. Please check the "
        "permissions of the directory you are trying to run CMake on.");
      return -1;
    }
  }

  // setup CMAKE_ROOT and CMAKE_COMMAND
  if (!this->AddCMakePaths()) {
    return -3;
  }
  return 0;
}